

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O2

string * __thiscall S2CellId::ToString_abi_cxx11_(string *__return_storage_ptr__,S2CellId *this)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  AlphaNum *in_RCX;
  int current_level;
  int level;
  Hex hex;
  AlphaNum AStack_88;
  AlphaNum local_58;
  
  uVar1 = this->id_;
  uVar2 = (uint)(uVar1 >> 0x20);
  if ((uVar2 >> 0x1e < 3) &&
     (in_RCX = (AlphaNum *)(uVar1 & 0x1555555555555555 & -uVar1), in_RCX != (AlphaNum *)0x0)) {
    absl::AlphaNum::AlphaNum(&local_58,uVar2 >> 0x1d);
    absl::string_view::string_view(&AStack_88.piece_,"/");
    absl::StrCat_abi_cxx11_(__return_storage_ptr__,(absl *)&local_58,&AStack_88,in_RCX);
    level = 1;
    while( true ) {
      iVar3 = S2CellId::level(this);
      if (iVar3 < level) break;
      child_position(this,level);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      level = level + 1;
    }
  }
  else {
    absl::string_view::string_view(&local_58.piece_,"Invalid: ");
    hex.width = '\x10';
    hex.fill = '0';
    hex._10_6_ = 0;
    hex.value = this->id_;
    absl::AlphaNum::AlphaNum(&AStack_88,hex);
    absl::StrCat_abi_cxx11_(__return_storage_ptr__,(absl *)&local_58,&AStack_88,in_RCX);
  }
  return __return_storage_ptr__;
}

Assistant:

string S2CellId::ToString() const {
  if (!is_valid()) {
    return StrCat("Invalid: ", absl::Hex(id(), absl::kZeroPad16));
  }
  string out = StrCat(face(), "/");
  for (int current_level = 1; current_level <= level(); ++current_level) {
    // Avoid dependencies of SimpleItoA, and slowness of StrAppend &
    // std::to_string.
    out += "0123"[child_position(current_level)];
  }
  return out;
}